

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

bool QtPrivate::intersect_rect
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  QGraphicsItemPrivate *pQVar1;
  double dVar2;
  qreal qVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  qreal *pqVar7;
  QTransform *pQVar8;
  QRectF *this;
  long in_FS_OFFSET;
  byte bVar9;
  QPainterPath rectPath;
  QPainterPath itemPath;
  QTransform transform;
  QRectF local_188;
  QRectF local_168;
  QRectF local_148;
  QRectF local_128 [2];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar9 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_148.xp = *intersectData;
  local_148.yp = *(qreal *)((long)intersectData + 8);
  local_148.w = *(qreal *)((long)intersectData + 0x10);
  local_148.h = *(qreal *)((long)intersectData + 0x18);
  local_168.w = -NAN;
  local_168.h = -NAN;
  local_168.yp._0_4_ = 0xffffffff;
  local_168.xp = -NAN;
  local_168.yp._4_4_ = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_168,item);
  if ((local_168.w == 0.0) && (!NAN(local_168.w))) {
    local_168.yp = local_168.yp + 0.0;
    local_168.xp = local_168.xp + -1e-05;
    local_168.w = local_168.w + 2e-05;
    local_168.h = local_168.h + 0.0;
  }
  if ((local_168.h == 0.0) && (!NAN(local_168.h))) {
    dVar2 = local_168.yp + -1e-05;
    local_168.yp._0_4_ = SUB84(dVar2,0);
    local_168.xp = local_168.xp + 0.0;
    local_168.yp._4_4_ = (int)((ulong)dVar2 >> 0x20);
    local_168.h = local_168.h + 2e-05;
  }
  pQVar1 = (item->d_ptr).d;
  if ((*(ulong *)&pQVar1->field_0x160 & 0x2000040000) == 0) {
    local_d8.m_matrix[0][2] = -NAN;
    local_d8.m_matrix[1][0] = -NAN;
    local_d8.m_matrix[0][1]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][0] = -NAN;
    local_d8.m_matrix[0][1]._4_4_ = 0xffffffff;
    if ((*(ulong *)&pQVar1->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_d8);
    }
    else {
      dVar2 = (pQVar1->sceneTransform).m_matrix[2][1] + local_168.yp;
      local_d8.m_matrix[0][1]._0_4_ = SUB84(dVar2,0);
      local_d8.m_matrix[0][0] = (pQVar1->sceneTransform).m_matrix[2][0] + local_168.xp;
      local_d8.m_matrix[0][1]._4_4_ = (int)((ulong)dVar2 >> 0x20);
      local_d8.m_matrix[0][2] = local_168.w;
      local_d8.m_matrix[1][0] = local_168.h;
    }
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      bVar5 = comparesEqual(&local_148,&local_168);
      if (bVar5) goto LAB_00628ef1;
      cVar4 = QRectF::contains(&local_148);
    }
    else {
      cVar4 = QRectF::intersects(&local_148);
    }
    if (cVar4 != '\x01' || IntersectsItemShape < mode) goto LAB_00628fec;
    local_128[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)local_128);
    QPainterPath::addRect(local_128);
    if ((*(ulong *)&pQVar1->field_0x160 & 0x4000000000000000) == 0) {
      QTransform::inverted((bool *)&local_88);
      QTransform::map((QPainterPath *)&local_188);
      qVar3 = local_128[0].xp;
      local_128[0].xp = local_188.xp;
      local_188.xp = qVar3;
      QPainterPath::~QPainterPath((QPainterPath *)&local_188);
    }
    else {
      QPainterPath::translate
                (-(pQVar1->sceneTransform).m_matrix[2][0],-(pQVar1->sceneTransform).m_matrix[2][1]);
    }
    this = local_128;
  }
  else {
    pqVar7 = (qreal *)&DAT_006f4bb8;
    pQVar8 = &local_88;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pQVar8->m_matrix[0][0] = *pqVar7;
      pqVar7 = pqVar7 + (ulong)bVar9 * -2 + 1;
      pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    QGraphicsItem::deviceTransform(&local_88,item,deviceTransform);
    local_188.w._0_4_ = 0xffffffff;
    local_188.w._4_4_ = 0xffffffff;
    local_188.h._0_4_ = 0xffffffff;
    local_188.h._4_4_ = 0xffffffff;
    local_188.xp = -NAN;
    local_188.yp._0_4_ = 0xffffffff;
    local_188.yp._4_4_ = 0xffffffff;
    QTransform::inverted((bool *)local_128);
    QTransform::operator*(&local_d8,deviceTransform);
    QTransform::mapRect(&local_188);
    if ((mode & ~ContainsItemBoundingRect) == ContainsItemShape) {
      cVar4 = QRectF::contains(&local_188);
      if (cVar4 == '\0') {
LAB_00628ef1:
        cVar4 = '\0';
        goto LAB_00628fec;
      }
      bVar5 = comparesEqual(&local_188,&local_168);
      cVar4 = !bVar5;
    }
    else {
      cVar4 = QRectF::intersects(&local_188);
    }
    if (cVar4 != '\x01' || IntersectsItemShape < mode) goto LAB_00628fec;
    this = (QRectF *)&local_d8;
    local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath((QPainterPath *)this);
    QPainterPath::addRect(this);
  }
  cVar4 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item,(QPainterPath *)this,mode);
  QPainterPath::~QPainterPath((QPainterPath *)this);
LAB_00628fec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar4;
}

Assistant:

static bool intersect_rect(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QRectF sceneRect = *static_cast<const QRectF *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QRectF itemRect = (deviceTransform * transform.inverted()).mapRect(sceneRect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemRect.contains(brect) && itemRect != brect;
            else
                keep = itemRect.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath;
                itemPath.addRect(itemRect);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = sceneRect != brect && sceneRect.contains(itemSceneBoundingRect);
            else
                keep = sceneRect.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath rectPath;
                rectPath.addRect(sceneRect);
                if (itemd->sceneTransformTranslateOnly)
                    rectPath.translate(-itemd->sceneTransform.dx(), -itemd->sceneTransform.dy());
                else
                    rectPath = itemd->sceneTransform.inverted().map(rectPath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, rectPath, mode);
            }
        }
        return keep;
    }